

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

bool * __thiscall
google::protobuf::Reflection::GetRaw<bool>(Reflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  OneofDescriptor *pOVar2;
  bool *pbVar3;
  FieldDescriptor *in_RDX;
  ReflectionSchema *in_RSI;
  Reflection *in_RDI;
  undefined4 in_stack_ffffffffffffffc8;
  uint32 in_stack_ffffffffffffffcc;
  Reflection *in_stack_ffffffffffffffd0;
  
  pOVar2 = FieldDescriptor::containing_oneof(in_RDX);
  if ((pOVar2 != (OneofDescriptor *)0x0) &&
     (bVar1 = HasOneofField(in_RDI,(Message *)in_RSI,in_RDX), !bVar1)) {
    pbVar3 = DefaultRaw<bool>(in_stack_ffffffffffffffd0,
                              (FieldDescriptor *)
                              CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    return pbVar3;
  }
  internal::ReflectionSchema::GetFieldOffset(in_RSI,in_RDX);
  pbVar3 = anon_unknown_0::GetConstRefAtOffset<bool>((Message *)in_RSI,in_stack_ffffffffffffffcc);
  return pbVar3;
}

Assistant:

const Type& Reflection::GetRaw(const Message& message,
                               const FieldDescriptor* field) const {
  if (field->containing_oneof() && !HasOneofField(message, field)) {
    return DefaultRaw<Type>(field);
  }
  return GetConstRefAtOffset<Type>(message, schema_.GetFieldOffset(field));
}